

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v10::detail::write_int<fmt::v10::appender,unsigned_long,char>
                   (appender out,unsigned_long value,uint prefix,format_specs<char> *specs,
                   digit_grouping<char> *grouping)

{
  presentation_type pVar1;
  uint uVar2;
  int iVar3;
  type tVar4;
  type tVar5;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bVar6;
  uint uVar7;
  ulong size;
  uint prefix_local;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_268;
  anon_class_24_3_e2c60416 local_260;
  memory_buffer buffer;
  
  buffer.super_buffer<char>.ptr_ = buffer.store_;
  buffer.super_buffer<char>.size_ = 0;
  buffer.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_001d0ca8;
  buffer.super_buffer<char>.capacity_ = 500;
  pVar1 = specs->type;
  prefix_local = prefix;
  local_268 = out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  switch(pVar1) {
  case none:
  case dec:
    iVar3 = do_count_digits(value);
    format_decimal<char,_unsigned_long,_fmt::v10::appender,_0>((appender)&buffer,value,iVar3);
    break;
  case oct:
    iVar3 = count_digits<3,unsigned_long>(value);
    if ((((specs->field_0x9 & 0x80) != 0) && (value != 0)) && (specs->precision <= iVar3)) {
      uVar7 = 0x3000;
      if (prefix == 0) {
        uVar7 = 0x30;
      }
      prefix = (uVar7 | prefix) + 0x1000000;
      prefix_local = prefix;
    }
    format_uint<3u,char,fmt::v10::appender,unsigned_long>((appender)&buffer,value,iVar3,false);
    break;
  case hex_lower:
  case hex_upper:
    if ((specs->field_0x9 & 0x80) != 0) {
      uVar2 = (uint)(pVar1 != hex_upper) << 0xd | 0x5830;
      uVar7 = uVar2 << 8;
      if (prefix == 0) {
        uVar7 = uVar2;
      }
      prefix_local = (uVar7 | prefix) + 0x2000000;
    }
    prefix = prefix_local;
    iVar3 = count_digits<4,unsigned_long>(value);
    format_uint<4u,char,fmt::v10::appender,unsigned_long>
              ((appender)&buffer,value,iVar3,pVar1 == hex_upper);
    break;
  case bin_lower:
  case bin_upper:
    if ((specs->field_0x9 & 0x80) != 0) {
      uVar2 = (uint)(pVar1 != bin_upper) << 0xd | 0x4230;
      uVar7 = uVar2 << 8;
      if (prefix == 0) {
        uVar7 = uVar2;
      }
      prefix_local = (uVar7 | prefix) + 0x2000000;
    }
    prefix = prefix_local;
    iVar3 = count_digits<1,unsigned_long>(value);
    format_uint<1u,char,fmt::v10::appender,unsigned_long>((appender)&buffer,value,iVar3,false);
    break;
  default:
    throw_format_error("invalid format specifier");
  case chr:
    bVar6.container = (buffer<char> *)write_char<char,fmt::v10::appender>(out,(char)value,specs);
    goto LAB_00130f59;
  }
  tVar4 = to_unsigned<int>(iVar3);
  iVar3 = digit_grouping<char>::count_separators(grouping,iVar3);
  tVar5 = to_unsigned<int>(iVar3);
  size = (ulong)((prefix >> 0x18) + tVar4 + tVar5);
  local_260.prefix = &prefix_local;
  local_260.buffer = &buffer;
  local_260.grouping = grouping;
  bVar6.container =
       (buffer<char> *)
       write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_int<fmt::v10::appender,unsigned_long,char>(fmt::v10::appender,unsigned_long,unsigned_int,fmt::v10::format_specs<char>const&,fmt::v10::detail::digit_grouping<char>const&)::_lambda(fmt::v10::appender)_1_>
                 (local_268.container,specs,size,size,&local_260);
LAB_00130f59:
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::deallocate(&buffer);
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)bVar6.container;
}

Assistant:

auto write_int(OutputIt out, UInt value, unsigned prefix,
               const format_specs<Char>& specs,
               const digit_grouping<Char>& grouping) -> OutputIt {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  int num_digits = 0;
  auto buffer = memory_buffer();
  switch (specs.type) {
  case presentation_type::none:
  case presentation_type::dec: {
    num_digits = count_digits(value);
    format_decimal<char>(appender(buffer), value, num_digits);
    break;
  }
  case presentation_type::hex_lower:
  case presentation_type::hex_upper: {
    bool upper = specs.type == presentation_type::hex_upper;
    if (specs.alt)
      prefix_append(prefix, unsigned(upper ? 'X' : 'x') << 8 | '0');
    num_digits = count_digits<4>(value);
    format_uint<4, char>(appender(buffer), value, num_digits, upper);
    break;
  }
  case presentation_type::bin_lower:
  case presentation_type::bin_upper: {
    bool upper = specs.type == presentation_type::bin_upper;
    if (specs.alt)
      prefix_append(prefix, unsigned(upper ? 'B' : 'b') << 8 | '0');
    num_digits = count_digits<1>(value);
    format_uint<1, char>(appender(buffer), value, num_digits);
    break;
  }
  case presentation_type::oct: {
    num_digits = count_digits<3>(value);
    // Octal prefix '0' is counted as a digit, so only add it if precision
    // is not greater than the number of digits.
    if (specs.alt && specs.precision <= num_digits && value != 0)
      prefix_append(prefix, '0');
    format_uint<3, char>(appender(buffer), value, num_digits);
    break;
  }
  case presentation_type::chr:
    return write_char(out, static_cast<Char>(value), specs);
  default:
    throw_format_error("invalid format specifier");
  }

  unsigned size = (prefix != 0 ? prefix >> 24 : 0) + to_unsigned(num_digits) +
                  to_unsigned(grouping.count_separators(num_digits));
  return write_padded<align::right>(
      out, specs, size, size, [&](reserve_iterator<OutputIt> it) {
        for (unsigned p = prefix & 0xffffff; p != 0; p >>= 8)
          *it++ = static_cast<Char>(p & 0xff);
        return grouping.apply(it, string_view(buffer.data(), buffer.size()));
      });
}